

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

shared_ptr<QPDFJob::UOConfig> __thiscall QPDFJob::Config::overlay(Config *this)

{
  element_type *peVar1;
  QPDFJob *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RSI;
  shared_ptr<QPDFJob::UOConfig> sVar2;
  
  std::vector<QPDFJob::UnderOverlay,std::allocator<QPDFJob::UnderOverlay>>::
  emplace_back<char_const(&)[8]>
            ((vector<QPDFJob::UnderOverlay,std::allocator<QPDFJob::UnderOverlay>> *)
             &((((QPDFJob *)
                (in_RSI->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m)
               .super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->overlay,
             (char (*) [8])0x26f8e7);
  peVar1 = (((QPDFJob *)
            (in_RSI->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m).
           super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->under_overlay =
       *(pointer *)
        ((long)&(peVar1->overlay).
                super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>.
                _M_impl.super__Vector_impl_data + 8) + -1;
  __p = (QPDFJob *)operator_new(8);
  (__p->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RSI;
  this->o = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QPDFJob::UOConfig*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 1),(UOConfig *)__p);
  sVar2.super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<QPDFJob::UOConfig>)
         sVar2.super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFJob::UOConfig>
QPDFJob::Config::overlay()
{
    o.m->overlay.emplace_back("overlay");
    o.m->under_overlay = &o.m->overlay.back();
    return std::shared_ptr<UOConfig>(new UOConfig(this));
}